

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerReflection::emit_types(CompilerReflection *this)

{
  uint type_id;
  uint32_t uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRType *type;
  SPIRType *pSVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  bool emitted_open_tag;
  SmallVector<unsigned_int,_8UL> physical_pointee_types;
  bool local_71;
  LoopLock local_70;
  SmallVector<unsigned_int,_8UL> local_68;
  
  local_71 = false;
  local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  local_68.buffer_capacity = 8;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar8 = 0;
    do {
      type_id = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[type_id].type == TypeType) {
        type = Variant::get<spirv_cross::SPIRType>(pVVar4 + type_id);
        if (((type->basetype == Struct) && (type->pointer == false)) &&
           ((type->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
          emit_type(this,type_id,&local_71);
        }
        else {
          bVar5 = type_is_reference(this,type);
          if (bVar5) {
            pSVar6 = Variant::get<spirv_cross::SPIRType>
                               ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + (type->parent_type).id)
            ;
            if (((pSVar6->basetype != Struct) || (pSVar6->pointer != false)) ||
               ((pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
              puVar7 = ::std::
                       __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)1>const>>
                                 (local_68.super_VectorView<unsigned_int>.ptr,
                                  (char *)local_68.super_VectorView<unsigned_int>.ptr +
                                  local_68.super_VectorView<unsigned_int>.buffer_size * 4,
                                  &type->parent_type);
              if (puVar7 == (uint *)((char *)local_68.super_VectorView<unsigned_int>.ptr +
                                    local_68.super_VectorView<unsigned_int>.buffer_size * 4)) {
                uVar1 = (type->parent_type).id;
                SmallVector<unsigned_int,_8UL>::reserve
                          (&local_68,local_68.super_VectorView<unsigned_int>.buffer_size + 1);
                *(uint32_t *)
                 ((char *)local_68.super_VectorView<unsigned_int>.ptr +
                 local_68.super_VectorView<unsigned_int>.buffer_size * 4) = uVar1;
                local_68.super_VectorView<unsigned_int>.buffer_size =
                     local_68.super_VectorView<unsigned_int>.buffer_size + 1;
              }
            }
          }
        }
      }
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
  }
  ParsedIR::LoopLock::~LoopLock(&local_70);
  puVar7 = local_68.super_VectorView<unsigned_int>.ptr;
  if (local_68.super_VectorView<unsigned_int>.buffer_size != 0) {
    lVar9 = local_68.super_VectorView<unsigned_int>.buffer_size << 2;
    lVar8 = 0;
    do {
      emit_type(this,*(uint32_t *)((char *)puVar7 + lVar8),&local_71);
      lVar8 = lVar8 + 4;
    } while (lVar9 != lVar8);
  }
  if (local_71 != false) {
    simple_json::Stream::end_json_object
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr !=
      &local_68.stack_storage) {
    free(local_68.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerReflection::emit_types()
{
	bool emitted_open_tag = false;

	SmallVector<uint32_t> physical_pointee_types;

	// If we have physical pointers or arrays of physical pointers, it's also helpful to emit the pointee type
	// and chain the type hierarchy. For POD, arrays can emit the entire type in-place.
	ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
		if (naturally_emit_type(type))
		{
			emit_type(self, emitted_open_tag);
		}
		else if (type_is_reference(type))
		{
			if (!naturally_emit_type(this->get<SPIRType>(type.parent_type)) &&
			    find(physical_pointee_types.begin(), physical_pointee_types.end(), type.parent_type) ==
			        physical_pointee_types.end())
			{
				physical_pointee_types.push_back(type.parent_type);
			}
		}
	});

	for (uint32_t pointee_type : physical_pointee_types)
		emit_type(pointee_type, emitted_open_tag);

	if (emitted_open_tag)
	{
		json_stream->end_json_object();
	}
}